

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.cc
# Opt level: O1

void brotli::StoreMetaBlockHeader
               (size_t len,bool is_uncompressed,size_t *storage_ix,uint8_t *storage)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar1 = *storage_ix;
  *(ulong *)(storage + (uVar1 >> 3)) = (ulong)storage[uVar1 >> 3];
  uVar4 = uVar1 + 1;
  *storage_ix = uVar4;
  uVar2 = uVar4 >> 3;
  if (len < 0x10001) {
    *(ulong *)(storage + uVar2) = (ulong)storage[uVar2];
    *storage_ix = uVar1 + 3;
    lVar3 = 0x13;
    if (len - 1 < 0x10000) {
LAB_0018016e:
      uVar4 = uVar1 + 3 >> 3;
      *(size_t *)(storage + uVar4) = len - 1 << ((byte)(uVar1 + 3) & 7) | (ulong)storage[uVar4];
      uVar4 = uVar1 + lVar3;
      *storage_ix = uVar4;
      *(ulong *)(storage + (uVar4 >> 3)) =
           (ulong)is_uncompressed << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
      *storage_ix = uVar1 + lVar3 + 1;
      return;
    }
  }
  else {
    *(ulong *)(storage + uVar2) = (ulong)storage[uVar2] | 1L << ((byte)uVar4 & 7);
    *storage_ix = uVar1 + 3;
    if (len < 0x100001) {
      lVar3 = 0x17;
      goto LAB_0018016e;
    }
  }
  __assert_fail("(bits >> n_bits) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/./write_bits.h"
                ,0x2c,
                "void brotli::WriteBits(size_t, uint64_t, size_t *__restrict, uint8_t *__restrict)")
  ;
}

Assistant:

static void StoreMetaBlockHeader(
    size_t len, bool is_uncompressed, size_t* storage_ix, uint8_t* storage) {
  // ISLAST
  WriteBits(1, 0, storage_ix, storage);
  if (len <= (1U << 16)) {
    // MNIBBLES is 4
    WriteBits(2, 0, storage_ix, storage);
    WriteBits(16, len - 1, storage_ix, storage);
  } else {
    // MNIBBLES is 5
    WriteBits(2, 1, storage_ix, storage);
    WriteBits(20, len - 1, storage_ix, storage);
  }
  // ISUNCOMPRESSED
  WriteBits(1, is_uncompressed, storage_ix, storage);
}